

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O0

_Bool source_can_light_wall(chunk_conflict *c,player *p,loc sgrid,loc wgrid)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t wVar2;
  loc grid1;
  loc grid1_00;
  wchar_t local_48;
  wchar_t wStack_44;
  loc cn;
  loc pn;
  loc sn;
  player *p_local;
  chunk_conflict *c_local;
  wchar_t wStack_18;
  loc wgrid_local;
  loc sgrid_local;
  
  wVar2 = motion_dir(wgrid,sgrid);
  grid1 = next_grid(wgrid,wVar2);
  _Var1 = loc_eq(grid1,wgrid);
  if (_Var1) {
    sgrid_local.x._3_1_ = true;
  }
  else {
    wVar2 = motion_dir(wgrid,p->grid);
    grid1_00 = next_grid(wgrid,wVar2);
    _Var1 = loc_eq(grid1_00,wgrid);
    if (_Var1) {
      sgrid_local.x._3_1_ = true;
    }
    else {
      pn.x = grid1.x;
      cn.x = grid1_00.x;
      cn.y = grid1_00.y;
      pn.y = grid1.y;
      if (pn.x == cn.x) {
        if (pn.y == cn.y) {
          return true;
        }
        local_48 = pn.x;
        wStack_18 = wgrid.y;
        wStack_44 = wStack_18;
      }
      else {
        if (pn.y != cn.y) {
          return false;
        }
        c_local._4_4_ = wgrid.x;
        local_48 = c_local._4_4_;
        wStack_44 = pn.y;
      }
      grid.y = wStack_44;
      grid.x = local_48;
      sgrid_local.x._3_1_ = square_allowslos((chunk *)c,grid);
    }
  }
  return sgrid_local.x._3_1_;
}

Assistant:

static bool source_can_light_wall(struct chunk *c, struct player *p,
		struct loc sgrid, struct loc wgrid)
{
	struct loc sn = next_grid(wgrid, motion_dir(wgrid, sgrid)), pn, cn;

	/*
	 * If the light source is coincident with the wall, all faces will be
	 * lit, and the player can potentially see it if it's within range and
	 * the line of sight isn't broken.
	 */
	if (loc_eq(sn, wgrid)) return true;

	/*
	 * If the player is coincident with the wall, all faces of the wall are
	 * visible to the player and the player can see whichever of those is
	 * lit by the light source.
	 */
	pn = next_grid(wgrid, motion_dir(wgrid, p->grid));
	if (loc_eq(pn, wgrid)) return true;

	/*
	 * For the lit face of the wall to be visible to the player, the
	 * view directions from the wall to the player and the wall to the
	 * light source must share at least one component.
	 */
	if (sn.x == pn.x) {
		/*
		 * If the view directions share both components, the lit face
		 * will be visible to the player if in range and the line of
		 * sight isn't broken.
		 */
		if (sn.y == pn.y) return true;
		cn.x = sn.x;
		cn.y = wgrid.y;
	} else if (sn.y == pn.y) {
		cn.x = wgrid.x;
		cn.y = sn.y;
	} else {
		/*
		 * If the view directions don't share a component, the lit face
		 * is not visible to the player.
		 */
		return false;
	}

	/*
	 * When only one component of the view directions is shared, take the
	 * common component and test whether there's a wall there that would
	 * block the player's view of the lit face.  That prevents instances
	 * like this:
	 *  p
	 * ###1#
	 *  @
	 * where both the light-emitting monster, 'p', and the player, '@',
	 * have line of sight to the wall, '1', but the face of '1' that would
	 * be lit is blocked by the wall immediately to the left of '1'.
	 */
	return square_allowslos(c, cn);
}